

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLcode hds_cw_collect_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  curl_trc_feat *pcVar1;
  byte type_00;
  CURLcode CVar2;
  
  if ((type & 0xcU) == 4) {
    type_00 = 4;
    if (((type & 0x10U) == 0) && (type_00 = 8, (type & 0x20U) == 0)) {
      type_00 = 2 - ((type & 0x40U) == 0);
    }
    CVar2 = Curl_headers_push(data,buf,type_00);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"header_collect pushed(type=%x, len=%zu) -> %d",(ulong)type_00,blen,
                     (ulong)CVar2);
    }
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  CVar2 = Curl_cwriter_write(data,writer->next,type,buf,blen);
  return CVar2;
}

Assistant:

static CURLcode hds_cw_collect_write(struct Curl_easy *data,
                                     struct Curl_cwriter *writer, int type,
                                     const char *buf, size_t blen)
{
  if((type & CLIENTWRITE_HEADER) && !(type & CLIENTWRITE_STATUS)) {
    unsigned char htype = (unsigned char)
      (type & CLIENTWRITE_CONNECT ? CURLH_CONNECT :
       (type & CLIENTWRITE_1XX ? CURLH_1XX :
        (type & CLIENTWRITE_TRAILER ? CURLH_TRAILER :
         CURLH_HEADER)));
    CURLcode result = Curl_headers_push(data, buf, htype);
    CURL_TRC_WRITE(data, "header_collect pushed(type=%x, len=%zu) -> %d",
                   htype, blen, result);
    if(result)
      return result;
  }
  return Curl_cwriter_write(data, writer->next, type, buf, blen);
}